

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O1

XMLCh __thiscall xercesc_4_0::ReaderMgr::peekNextChar(ReaderMgr *this)

{
  XMLCh XVar1;
  XMLReader *pXVar2;
  bool bVar3;
  XMLCh XVar4;
  
  pXVar2 = this->fCurReader;
  if ((pXVar2->fCharIndex < pXVar2->fCharsAvail) ||
     (bVar3 = XMLReader::refreshCharBuffer(pXVar2), bVar3)) {
    XVar4 = pXVar2->fCharBuf[pXVar2->fCharIndex];
    if ((XVar4 == L'\r') ||
       ((bVar3 = true, pXVar2->fNEL == true && ((XVar4 == L'\x2028' || (XVar4 == L'\x85')))))) {
      XVar1 = L'\n';
      if (pXVar2->fSource != Source_External) {
        XVar1 = XVar4;
      }
      XVar4 = XVar1;
      bVar3 = true;
    }
  }
  else {
    XVar4 = L'\0';
    bVar3 = false;
  }
  if (!bVar3) {
    bVar3 = popReader(this);
    if ((bVar3) &&
       ((pXVar2 = this->fCurReader, pXVar2->fCharIndex < pXVar2->fCharsAvail ||
        (bVar3 = XMLReader::refreshCharBuffer(pXVar2), bVar3)))) {
      XVar1 = pXVar2->fCharBuf[pXVar2->fCharIndex];
      XVar4 = XVar1;
      if (((XVar1 == L'\r') ||
          ((pXVar2->fNEL == true && ((XVar1 == L'\x2028' || (XVar1 == L'\x85')))))) &&
         (XVar4 = L'\n', pXVar2->fSource != Source_External)) {
        XVar4 = XVar1;
      }
    }
    else {
      XVar4 = L'\0';
    }
  }
  return XVar4;
}

Assistant:

XMLCh ReaderMgr::peekNextChar()
{
    XMLCh chRet;
    if (fCurReader->peekNextChar(chRet))
        return chRet;

    //
    //  Didn't get anything back so this reader is hosed. So lets move to
    //  the next reader on the stack. If this fails, it will be because
    //  its the end of the original file, and we just return zero.
    //
    if (!popReader())
        return XMLCh(0);

    // Else peek again and return the character
    fCurReader->peekNextChar(chRet);
    return chRet;
}